

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowTitleBarContents
               (ImGuiWindow *window,ImRect *title_bar_rect,char *name,bool *p_open)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  undefined1 *in_RCX;
  ImRect *in_RSI;
  long in_RDI;
  byte bVar4;
  ImVec2 IVar5;
  ImVec2 off;
  ImVec2 marker_pos;
  ImRect clip_r;
  ImRect layout_r;
  float pad_extend;
  float centerness;
  ImVec2 text_size;
  float marker_size_x;
  char *UNSAVED_DOCUMENT_MARKER;
  ImVec2 collapse_button_pos;
  ImVec2 close_button_pos;
  float button_sz;
  float pad_r;
  float pad_l;
  ImGuiItemFlags item_flags_backup;
  bool has_collapse_button;
  bool has_close_button;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffea8;
  ImVec2 *pIVar6;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImRect *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ImVec2 *in_stack_fffffffffffffed8;
  ImVec2 *this;
  ImVec2 *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  ImVec2 *this_00;
  undefined4 in_stack_fffffffffffffef8;
  float fVar7;
  uint3 in_stack_ffffffffffffff00;
  uint uVar8;
  byte bVar9;
  float in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar10;
  ImVec2 local_e4;
  ImVec2 *in_stack_ffffffffffffff28;
  ImGuiID in_stack_ffffffffffffff34;
  ImVec2 local_c4 [2];
  ImRect local_b4;
  float local_a4;
  float local_a0;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  float local_7c;
  ImVec2 *local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  undefined2 in_stack_ffffffffffffffc8;
  uint uVar11;
  ImGuiStyle *pIVar12;
  
  pIVar1 = GImGui;
  pIVar12 = &GImGui->Style;
  uVar11 = *(uint *)(in_RDI + 0xc);
  bVar4 = in_RCX != (undefined1 *)0x0;
  uVar8 = (uint)in_stack_ffffffffffffff00;
  if ((uVar11 & 0x20) == 0) {
    uVar8 = CONCAT13((GImGui->Style).WindowMenuButtonPosition != -1,in_stack_ffffffffffffff00);
  }
  bVar9 = (byte)(uVar8 >> 0x18);
  local_3c = *(undefined4 *)(in_RDI + 0x1b8);
  *(uint *)(in_RDI + 0x1b8) = *(uint *)(in_RDI + 0x1b8) | 0x10;
  *(undefined4 *)(in_RDI + 0x13c) = 1;
  *(undefined4 *)(in_RDI + 0x140) = 2;
  local_40 = (pIVar1->Style).FramePadding.x;
  local_44 = (pIVar1->Style).FramePadding.x;
  local_48 = pIVar1->FontSize;
  ImVec2::ImVec2(&local_50);
  ImVec2::ImVec2(&local_58);
  if ((bVar4 & 1) != 0) {
    local_44 = local_48 + local_44;
    ImVec2::ImVec2(&local_60,((in_RSI->Max).x - local_44) - (pIVar12->FramePadding).x,
                   (in_RSI->Min).y);
    local_50 = local_60;
  }
  if (((bVar9 & 1) != 0) && (pIVar12->WindowMenuButtonPosition == 1)) {
    local_44 = local_48 + local_44;
    ImVec2::ImVec2(&local_68,((in_RSI->Max).x - local_44) - (pIVar12->FramePadding).x,
                   (in_RSI->Min).y);
    local_58 = local_68;
  }
  if (((bVar9 & 1) != 0) && (pIVar12->WindowMenuButtonPosition == 0)) {
    ImVec2::ImVec2(&local_70,((in_RSI->Min).x + local_40) - (pIVar12->FramePadding).x,
                   (in_RSI->Min).y);
    local_58 = local_70;
    local_40 = local_48 + local_40;
  }
  if ((bVar9 & 1) != 0) {
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    bVar2 = CollapseButton(in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
    if (bVar2) {
      *(undefined1 *)(in_RDI + 0x82) = 1;
    }
  }
  if ((bVar4 & 1) != 0) {
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    bVar2 = CloseButton((ImGuiID)pIVar12,
                        (ImVec2 *)
                        CONCAT44(uVar11,CONCAT13(bVar4,CONCAT12(bVar9,in_stack_ffffffffffffffc8))));
    if (bVar2) {
      *in_RCX = 0;
    }
  }
  *(undefined4 *)(in_RDI + 0x13c) = 0;
  *(undefined4 *)(in_RDI + 0x140) = 1;
  *(undefined4 *)(in_RDI + 0x1b8) = local_3c;
  local_78 = (ImVec2 *)0x26de2c;
  if ((uVar11 & 0x100000) == 0) {
    fVar7 = 0.0;
  }
  else {
    local_84 = CalcTextSize((char *)in_stack_fffffffffffffed8,
                            (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffec8,0));
    fVar7 = local_84.x;
  }
  local_7c = fVar7;
  local_94 = CalcTextSize((char *)in_stack_fffffffffffffed8,
                          (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                          SUB84(in_stack_fffffffffffffec8,0));
  this_00 = &local_9c;
  ImVec2::ImVec2(this_00,local_7c,0.0);
  local_8c = ::operator+(in_stack_fffffffffffffea8,(ImVec2 *)0x1faba1);
  if ((pIVar12->FramePadding).x <= local_40 && local_40 != (pIVar12->FramePadding).x) {
    local_40 = (pIVar1->Style).ItemInnerSpacing.x + local_40;
  }
  if ((pIVar12->FramePadding).x <= local_44 && local_44 != (pIVar12->FramePadding).x) {
    local_44 = (pIVar1->Style).ItemInnerSpacing.x + local_44;
  }
  if ((0.0 < (pIVar12->WindowTitleAlign).x) &&
     ((pIVar12->WindowTitleAlign).x <= 1.0 && (pIVar12->WindowTitleAlign).x != 1.0)) {
    fVar3 = -ABS((pIVar12->WindowTitleAlign).x - 0.5);
    local_a0 = ImSaturate(fVar3 + fVar3 + 1.0);
    in_stack_fffffffffffffeec = ImMax<float>(local_40,local_44);
    fVar3 = ImRect::GetWidth(in_RSI);
    local_a4 = ImMin<float>(in_stack_fffffffffffffeec,((fVar3 - local_40) - local_44) - local_8c.x);
    local_40 = ImMax<float>(local_40,local_a4 * local_a0);
    local_44 = ImMax<float>(local_44,local_a4 * local_a0);
  }
  ImRect::ImRect(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
  ImRect::ImRect(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
  pIVar6 = local_c4;
  RenderTextClipped((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,uVar8),
                    (ImVec2 *)CONCAT44(fVar7,in_stack_fffffffffffffef8),(char *)this_00,
                    (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if ((uVar11 & 0x100000) != 0) {
    fVar3 = ImRect::GetWidth(&local_b4);
    fVar3 = ImMax<float>(local_b4.Min.x,
                         (fVar3 - local_8c.x) * (pIVar12->WindowTitleAlign).x + local_b4.Min.x);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff2c,fVar3 + local_8c.x,local_b4.Min.y);
    fVar3 = 0.0;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff24,2.0 - local_7c,0.0);
    ::operator+(pIVar6,(ImVec2 *)0x1faee9);
    this = &local_e4;
    ImVec2::ImVec2(this,fVar3,(float)(int)(pIVar1->FontSize * -0.25));
    IVar5 = ::operator+(pIVar6,(ImVec2 *)0x1faf3f);
    fVar10 = IVar5.x;
    IVar5 = ::operator+(pIVar6,(ImVec2 *)0x1faf57);
    fVar3 = IVar5.y;
    pIVar6 = local_78;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff04,0.0,(pIVar12->WindowTitleAlign).y);
    RenderTextClipped((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,uVar8),
                      (ImVec2 *)CONCAT44(fVar7,in_stack_fffffffffffffef8),(char *)this_00,
                      (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),pIVar6,
                      this,(ImRect *)CONCAT44(fVar10,fVar3));
  }
  return;
}

Assistant:

void ImGui::RenderWindowTitleBarContents(ImGuiWindow* window, const ImRect& title_bar_rect, const char* name, bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    const bool has_close_button = (p_open != NULL);
    const bool has_collapse_button = !(flags & ImGuiWindowFlags_NoCollapse) && (style.WindowMenuButtonPosition != ImGuiDir_None);

    // Close & Collapse button are on the Menu NavLayer and don't default focus (unless there's nothing else on that layer)
    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNavDefaultFocus;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;
    window->DC.NavLayerCurrentMask = (1 << ImGuiNavLayer_Menu);

    // Layout buttons
    // FIXME: Would be nice to generalize the subtleties expressed here into reusable code.
    float pad_l = style.FramePadding.x;
    float pad_r = style.FramePadding.x;
    float button_sz = g.FontSize;
    ImVec2 close_button_pos;
    ImVec2 collapse_button_pos;
    if (has_close_button)
    {
        pad_r += button_sz;
        close_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        pad_r += button_sz;
        collapse_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        collapse_button_pos = ImVec2(title_bar_rect.Min.x + pad_l - style.FramePadding.x, title_bar_rect.Min.y);
        pad_l += button_sz;
    }

    // Collapse button (submitting first so it gets priority when choosing a navigation init fallback)
    if (has_collapse_button)
        if (CollapseButton(window->GetID("#COLLAPSE"), collapse_button_pos))
            window->WantCollapseToggle = true; // Defer actual collapsing to next frame as we are too far in the Begin() function

    // Close button
    if (has_close_button)
        if (CloseButton(window->GetID("#CLOSE"), close_button_pos))
            *p_open = false;

    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
    window->DC.ItemFlags = item_flags_backup;

    // Title bar text (with: horizontal alignment, avoiding collapse/close button, optional "unsaved document" marker)
    // FIXME: Refactor text alignment facilities along with RenderText helpers, this is WAY too much messy code..
    const char* UNSAVED_DOCUMENT_MARKER = "*";
    const float marker_size_x = (flags & ImGuiWindowFlags_UnsavedDocument) ? CalcTextSize(UNSAVED_DOCUMENT_MARKER, NULL, false).x : 0.0f;
    const ImVec2 text_size = CalcTextSize(name, NULL, true) + ImVec2(marker_size_x, 0.0f);

    // As a nice touch we try to ensure that centered title text doesn't get affected by visibility of Close/Collapse button,
    // while uncentered title text will still reach edges correct.
    if (pad_l > style.FramePadding.x)
        pad_l += g.Style.ItemInnerSpacing.x;
    if (pad_r > style.FramePadding.x)
        pad_r += g.Style.ItemInnerSpacing.x;
    if (style.WindowTitleAlign.x > 0.0f && style.WindowTitleAlign.x < 1.0f)
    {
        float centerness = ImSaturate(1.0f - ImFabs(style.WindowTitleAlign.x - 0.5f) * 2.0f); // 0.0f on either edges, 1.0f on center
        float pad_extend = ImMin(ImMax(pad_l, pad_r), title_bar_rect.GetWidth() - pad_l - pad_r - text_size.x);
        pad_l = ImMax(pad_l, pad_extend * centerness);
        pad_r = ImMax(pad_r, pad_extend * centerness);
    }

    ImRect layout_r(title_bar_rect.Min.x + pad_l, title_bar_rect.Min.y, title_bar_rect.Max.x - pad_r, title_bar_rect.Max.y);
    ImRect clip_r(layout_r.Min.x, layout_r.Min.y, layout_r.Max.x + g.Style.ItemInnerSpacing.x, layout_r.Max.y);
    //if (g.IO.KeyCtrl) window->DrawList->AddRect(layout_r.Min, layout_r.Max, IM_COL32(255, 128, 0, 255)); // [DEBUG]
    RenderTextClipped(layout_r.Min, layout_r.Max, name, NULL, &text_size, style.WindowTitleAlign, &clip_r);
    if (flags & ImGuiWindowFlags_UnsavedDocument)
    {
        ImVec2 marker_pos = ImVec2(ImMax(layout_r.Min.x, layout_r.Min.x + (layout_r.GetWidth() - text_size.x) * style.WindowTitleAlign.x) + text_size.x, layout_r.Min.y) + ImVec2(2 - marker_size_x, 0.0f);
        ImVec2 off = ImVec2(0.0f, IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClipped(marker_pos + off, layout_r.Max + off, UNSAVED_DOCUMENT_MARKER, NULL, NULL, ImVec2(0, style.WindowTitleAlign.y), &clip_r);
    }
}